

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

void mp_clear_multi(mp_int *mp,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  mp_int *next_mp;
  mp_int *in_stack_ffffffffffffff10;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  uint local_28;
  undefined4 local_24;
  mp_int *local_20;
  undefined1 *local_18;
  long local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_18 = local_d8;
  local_20 = (mp_int *)&stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  local_10 = in_RDI;
  local_8 = in_RDI;
  while (local_10 != 0) {
    mp_clear(in_stack_ffffffffffffff10);
    if (local_28 < 0x29) {
      lVar1 = (long)(int)local_28;
      local_28 = local_28 + 8;
      in_stack_ffffffffffffff10 = (mp_int *)(local_18 + lVar1);
    }
    else {
      in_stack_ffffffffffffff10 = local_20;
      local_20 = (mp_int *)&local_20->sign;
    }
    local_10._0_4_ = in_stack_ffffffffffffff10->used;
    local_10._4_4_ = in_stack_ffffffffffffff10->alloc;
  }
  return;
}

Assistant:

void mp_clear_multi(mp_int *mp, ...) 
{
    mp_int* next_mp = mp;
    va_list args;
    va_start(args, mp);
    while (next_mp != NULL) {
        mp_clear(next_mp);
        next_mp = va_arg(args, mp_int*);
    }
    va_end(args);
}